

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O2

STAmount * jbcoin::operator+(STAmount *__return_storage_ptr__,STAmount *v1,STAmount *v2)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int64_t iVar6;
  int64_t iVar7;
  mantissa_type mVar8;
  uint64_t uVar9;
  mantissa_type mVar10;
  SField *pSVar11;
  exponent_type exponent;
  int iVar12;
  int iVar13;
  uint64_t mantissa;
  
  bVar5 = areComparable(v1,v2);
  if (!bVar5) {
    Throw<std::runtime_error,char_const(&)[41]>
              ((char (*) [41])"Can\'t add amounts that are\'t comparable!");
  }
  mantissa = v2->mValue;
  if (mantissa == 0) {
    (__return_storage_ptr__->super_STBase).fName = (v1->super_STBase).fName;
    (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002f8010;
    uVar1 = *(undefined8 *)((v1->mIssue).currency.pn + 2);
    uVar2 = *(undefined8 *)((v1->mIssue).currency.pn + 4);
    uVar3 = *(undefined8 *)((v1->mIssue).account.pn + 1);
    uVar4 = *(undefined8 *)((v1->mIssue).account.pn + 3);
    mVar10 = v1->mValue;
    *(undefined8 *)(__return_storage_ptr__->mIssue).currency.pn =
         *(undefined8 *)(v1->mIssue).currency.pn;
    *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 2) = uVar1;
    *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = uVar2;
    *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 1) = uVar3;
    *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 3) = uVar4;
    __return_storage_ptr__->mValue = mVar10;
    *(undefined8 *)((long)&__return_storage_ptr__->mValue + 6) =
         *(undefined8 *)((long)&v1->mValue + 6);
    return __return_storage_ptr__;
  }
  mVar10 = v1->mValue;
  if (mVar10 == 0) {
    pSVar11 = (v1->super_STBase).fName;
    exponent = v2->mOffset;
    bVar5 = v2->mIsNegative;
  }
  else {
    if (v1->mIsNative == true) {
      pSVar11 = (v1->super_STBase).fName;
      iVar6 = getSNValue(v1);
      iVar7 = getSNValue(v2);
      (__return_storage_ptr__->super_STBase).fName = pSVar11;
      (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002f8010;
      (__return_storage_ptr__->mIssue).currency.pn[0] = 0;
      (__return_storage_ptr__->mIssue).currency.pn[1] = 0;
      (__return_storage_ptr__->mIssue).currency.pn[2] = 0;
      (__return_storage_ptr__->mIssue).currency.pn[3] = 0;
      (__return_storage_ptr__->mIssue).account.pn[3] = 0;
      (__return_storage_ptr__->mIssue).account.pn[4] = 0;
      *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = 0;
      (__return_storage_ptr__->mIssue).account.pn[1] = 0;
      (__return_storage_ptr__->mIssue).account.pn[2] = 0;
      __return_storage_ptr__->mOffset = 0;
      mVar8 = iVar7 + iVar6;
      mVar10 = -mVar8;
      if (0 < (long)mVar8) {
        mVar10 = mVar8;
      }
      __return_storage_ptr__->mIsNative = true;
      __return_storage_ptr__->mIsNegative = SUB81(mVar8 >> 0x3f,0);
      __return_storage_ptr__->mValue = mVar10;
      return __return_storage_ptr__;
    }
    exponent = v1->mOffset;
    iVar13 = v2->mOffset;
    mVar8 = -mVar10;
    if (v1->mIsNegative == false) {
      mVar8 = mVar10;
    }
    iVar12 = exponent;
    uVar9 = -mantissa;
    if (v2->mIsNegative == false) {
      uVar9 = mantissa;
    }
    for (; iVar12 < iVar13; iVar12 = iVar12 + 1) {
      mVar8 = (long)mVar8 / 10;
    }
    if (exponent <= iVar13) {
      exponent = iVar13;
    }
    iVar13 = exponent - iVar13;
    while (bVar5 = iVar13 != 0, iVar13 = iVar13 + -1, bVar5) {
      uVar9 = (long)uVar9 / 10;
    }
    if (uVar9 + mVar8 + 10 < 0x15) {
      pSVar11 = (v1->super_STBase).fName;
      mantissa = 0;
      exponent = 0;
    }
    else {
      mantissa = uVar9 + mVar8;
      pSVar11 = (v1->super_STBase).fName;
      if ((long)mantissa < 0) {
        mantissa = -mantissa;
        bVar5 = true;
        goto LAB_001d798c;
      }
    }
    bVar5 = false;
  }
LAB_001d798c:
  STAmount::STAmount(__return_storage_ptr__,pSVar11,&v1->mIssue,mantissa,exponent,bVar5);
  return __return_storage_ptr__;
}

Assistant:

STAmount operator+ (STAmount const& v1, STAmount const& v2)
{
    if (!areComparable (v1, v2))
        Throw<std::runtime_error> ("Can't add amounts that are't comparable!");

    if (v2 == zero)
        return v1;

    if (v1 == zero)
    {
        // Result must be in terms of v1 currency and issuer.
        return { v1.getFName (), v1.issue (),
            v2.mantissa (), v2.exponent (), v2.negative () };
    }

    if (v1.native ())
        return { v1.getFName (), getSNValue (v1) + getSNValue (v2) };

    int ov1 = v1.exponent (), ov2 = v2.exponent ();
    std::int64_t vv1 = static_cast<std::int64_t>(v1.mantissa ());
    std::int64_t vv2 = static_cast<std::int64_t>(v2.mantissa ());

    if (v1.negative ())
        vv1 = -vv1;

    if (v2.negative ())
        vv2 = -vv2;

    while (ov1 < ov2)
    {
        vv1 /= 10;
        ++ov1;
    }

    while (ov2 < ov1)
    {
        vv2 /= 10;
        ++ov2;
    }

    // This addition cannot overflow an std::int64_t. It can overflow an
    // STAmount and the constructor will throw.

    std::int64_t fv = vv1 + vv2;

    if ((fv >= -10) && (fv <= 10))
        return { v1.getFName (), v1.issue () };

    if (fv >= 0)
        return STAmount { v1.getFName (), v1.issue (),
            static_cast<std::uint64_t>(fv), ov1, false };

    return STAmount { v1.getFName (), v1.issue (),
        static_cast<std::uint64_t>(-fv), ov1, true };
}